

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_AddClientCA_Test::TestBody(SSLTest_AddClientCA_Test *this)

{
  int iVar1;
  SSL_METHOD *meth;
  X509_NAME *b;
  X509_NAME *pXVar2;
  OPENSSL_STACK *pOVar3;
  X509_NAME *pXVar4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<X509> cert1;
  UniquePtr<SSL> ssl;
  UniquePtr<X509> cert2;
  UniquePtr<SSL_CTX> ctx;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AssertHelper local_40;
  _Head_base<0UL,_x509_st_*,_false> local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  _Head_base<0UL,_x509_st_*,_false> local_28;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_20;
  
  meth = (SSL_METHOD *)TLS_method();
  local_20._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  local_70._M_head_impl._0_1_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       local_20._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      local_20._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,(AssertionResult *)0x336329,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6e2,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if ((SSL *)local_30._M_head_impl != (SSL *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    goto LAB_00161b60;
  }
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       SSL_new((SSL_CTX *)
               local_20._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_70._M_head_impl._0_1_ = (SSL *)local_30._M_head_impl != (SSL *)0x0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL *)local_30._M_head_impl == (SSL *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,(AssertionResult *)0x3422b7,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6e4,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if ((X509 *)local_38._M_head_impl != (X509 *)0x0) {
      (*(code *)((X509_CINF *)(local_38._M_head_impl)->cert_info)->serialNumber)();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  else {
    CertFromPEM((anon_unknown_0 *)&local_38,
                "-----BEGIN CERTIFICATE-----\nMIICWDCCAcGgAwIBAgIJAPuwTC6rEJsMMA0GCSqGSIb3DQEBBQUAMEUxCzAJBgNV\nBAYTAkFVMRMwEQYDVQQIDApTb21lLVN0YXRlMSEwHwYDVQQKDBhJbnRlcm5ldCBX\naWRnaXRzIFB0eSBMdGQwHhcNMTQwNDIzMjA1MDQwWhcNMTcwNDIyMjA1MDQwWjBF\nMQswCQYDVQQGEwJBVTETMBEGA1UECAwKU29tZS1TdGF0ZTEhMB8GA1UECgwYSW50\nZXJuZXQgV2lkZ2l0cyBQdHkgTHRkMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCBiQKB\ngQDYK8imMuRi/03z0K1Zi0WnvfFHvwlYeyK9Na6XJYaUoIDAtB92kWdGMdAQhLci\nHnAjkXLI6W15OoV3gA/ElRZ1xUpxTMhjP6PyY5wqT5r6y8FxbiiFKKAnHmUcrgfV\nW28tQ+0rkLGMryRtrukXOgXBv7gcrmU7G1jC2a7WqmeI8QIDAQABo1AwTjAdBgNV\nHQ4EFgQUi3XVrMsIvg4fZbf6Vr5sp3Xaha8wHwYDVR0jBBgwFoAUi3XVrMsIvg4f\nZbf6Vr5sp3Xaha8wDAYDVR0TBAUwAwEB/zANBgkqhkiG9w0BAQUFAAOBgQA76Hht\nldY9avcTGSwbwoiuIqv0jTL1fHFnzy3RHMLDh+Lpvolc5DSrSJHCP5WuK0eeJXhr\nT5oQpHL9z/cCDLAKCKRa4uV0fhEdOWBqyR9p8y5jJtye72t6CuFUV5iqcpF4BH4f\nj2VNHwsSrJwkD4QUGlUtH7vwnQmyCFxZMmWAJg==\n-----END CERTIFICATE-----\n"
               );
    GetChainTestCertificate();
    if ((X509 *)local_38._M_head_impl == (X509 *)0x0) {
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ulong)local_70._M_head_impl._1_7_ << 8);
LAB_00161aa3:
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_70,(AssertionResult *)"cert1 && cert2",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6e8,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
LAB_00161afc:
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_68;
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
      }
      local_58 = local_68;
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_00161b3d:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,local_58);
      }
    }
    else {
      local_70._M_head_impl._0_1_ = (X509 *)local_28._M_head_impl != (X509 *)0x0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((X509 *)local_28._M_head_impl == (X509 *)0x0) goto LAB_00161aa3;
      b = X509_get_subject_name((X509 *)local_38._M_head_impl);
      pXVar2 = X509_get_subject_name((X509 *)local_28._M_head_impl);
      local_78.data_._0_4_ = 0;
      pOVar3 = (OPENSSL_STACK *)SSL_get_client_CA_list((SSL *)local_30._M_head_impl);
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OPENSSL_sk_num(pOVar3);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_60,"0u","sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get()))",
                 (uint *)&local_78,(unsigned_long *)&local_70);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ec,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      iVar1 = SSL_add_client_CA((SSL *)local_30._M_head_impl,(X509 *)local_38._M_head_impl);
      local_70._M_head_impl._0_1_ = iVar1 != 0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_70,
                   (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ee,(char *)CONCAT71(local_60._1_7_,local_60[0]));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
        goto LAB_00161afc;
      }
      iVar1 = SSL_add_client_CA((SSL *)local_30._M_head_impl,(X509 *)local_28._M_head_impl);
      local_70._M_head_impl._0_1_ = iVar1 != 0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_70,
                   (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert2.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ef,(char *)CONCAT71(local_60._1_7_,local_60[0]));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
        goto LAB_00161afc;
      }
      pOVar3 = (OPENSSL_STACK *)SSL_get_client_CA_list((SSL *)local_30._M_head_impl);
      local_78.data_._0_4_ = 2;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OPENSSL_sk_num(pOVar3);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_60,"2u","sk_X509_NAME_num(list)",(uint *)&local_78,
                 (unsigned_long *)&local_70);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6f2,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        goto LAB_00162247;
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
      pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,0);
      local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,b);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_60,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",
                 (int *)&local_70,(int *)&local_78);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6f3,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
      pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,1);
      local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,pXVar2);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_60,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",
                 (int *)&local_70,(int *)&local_78);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6f4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
      iVar1 = SSL_add_client_CA((SSL *)local_30._M_head_impl,(X509 *)local_38._M_head_impl);
      local_70._M_head_impl._0_1_ = iVar1 != 0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_70,
                   (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6f6,(char *)CONCAT71(local_60._1_7_,local_60[0]));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
        goto LAB_00161afc;
      }
      pOVar3 = (OPENSSL_STACK *)SSL_get_client_CA_list((SSL *)local_30._M_head_impl);
      local_78.data_._0_4_ = 3;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OPENSSL_sk_num(pOVar3);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_60,"3u","sk_X509_NAME_num(list)",(uint *)&local_78,
                 (unsigned_long *)&local_70);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_58->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6f9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
LAB_00162247:
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      else {
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
        pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,0);
        local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,b);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_60,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",
                   (int *)&local_70,(int *)&local_78);
        if (local_60[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6fa,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
        pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,1);
        local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,pXVar2);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_60,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",
                   (int *)&local_70,(int *)&local_78);
        if (local_60[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6fb,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
        pXVar2 = (X509_NAME *)OPENSSL_sk_value(pOVar3,2);
        local_78.data_._0_4_ = X509_NAME_cmp(pXVar2,b);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_60,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1)",
                   (int *)&local_70,(int *)&local_78);
        if (local_60[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6fc,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
          goto LAB_00162247;
        }
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58;
        goto LAB_00161b3d;
      }
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_28);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_30);
LAB_00161b60:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return;
}

Assistant:

TEST(SSLTest, AddClientCA) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509> cert1 = GetTestCertificate();
  bssl::UniquePtr<X509> cert2 = GetChainTestCertificate();
  ASSERT_TRUE(cert1 && cert2);
  X509_NAME *name1 = X509_get_subject_name(cert1.get());
  X509_NAME *name2 = X509_get_subject_name(cert2.get());

  EXPECT_EQ(0u, sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get())));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));
  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert2.get()));

  STACK_OF(X509_NAME) *list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(2u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));

  list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(3u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1));
}